

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

Vec_Int_t *
Gla_ManUnsatCore(Gla_Man_t *p,int f,sat_solver2 *pSat,int nConfMax,int fVerbose,int *piRetValue,
                int *pnConfls)

{
  ABC_INT64_T AVar1;
  int iVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int iLit;
  timespec ts;
  int local_44;
  timespec local_40;
  
  AVar1 = (pSat->stats).conflicts;
  iVar2 = Gla_ManGetOutLit(p,f);
  local_44 = iVar2;
  clock_gettime(3,&local_40);
  if (piRetValue != (int *)0x0) {
    *piRetValue = 1;
  }
  if (iVar2 == -1) {
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 0x10;
    pVVar4->nSize = 0;
    piVar3 = (int *)malloc(0x40);
    pVVar4->pArray = piVar3;
    Vec_IntPush(pVVar4,p->pObjRoot->Fanins[0]);
  }
  else {
    iVar2 = sat_solver2_solve(pSat,&local_44,(lit *)&local_40,(long)nConfMax,0,0,0);
    if (pnConfls != (int *)0x0) {
      *pnConfls = (int)(pSat->stats).conflicts - (int)AVar1;
    }
    if (iVar2 == -1) {
      clock_gettime(3,&local_40);
      pVVar4 = (Vec_Int_t *)Sat_ProofCore(pSat);
      if (pVVar4 != (Vec_Int_t *)0x0) {
        qsort(pVVar4->pArray,(long)pVVar4->nSize,4,Vec_IntSortCompare2);
        return pVVar4;
      }
    }
    else if (iVar2 == 1) {
      if (piRetValue != (int *)0x0) {
        *piRetValue = 0;
      }
    }
    else {
      if (iVar2 != 0) {
        __assert_fail("RetValue == l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                      ,0x5cb,
                      "Vec_Int_t *Gla_ManUnsatCore(Gla_Man_t *, int, sat_solver2 *, int, int, int *, int *)"
                     );
      }
      if (piRetValue != (int *)0x0) {
        *piRetValue = -1;
      }
    }
    pVVar4 = (Vec_Int_t *)0x0;
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Gla_ManUnsatCore( Gla_Man_t * p, int f, sat_solver2 * pSat, int nConfMax, int fVerbose, int * piRetValue, int * pnConfls )
{
    Vec_Int_t * vCore = NULL;
    int nConfPrev = pSat->stats.conflicts;
    int RetValue, iLit = Gla_ManGetOutLit( p, f );
    abctime clk = Abc_Clock();
    if ( piRetValue )
        *piRetValue = 1;
    // consider special case when PO points to the flop
    // this leads to immediate conflict in the first timeframe
    if ( iLit == -1 )
    {
        vCore = Vec_IntAlloc( 1 );
        Vec_IntPush( vCore, p->pObjRoot->Fanins[0] );
        return vCore;
    }
    // solve the problem
    RetValue = sat_solver2_solve( pSat, &iLit, &iLit+1, (ABC_INT64_T)nConfMax, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( pnConfls )
        *pnConfls = (int)pSat->stats.conflicts - nConfPrev;
    if ( RetValue == l_Undef )
    {
        if ( piRetValue )
            *piRetValue = -1;
        return NULL;
    }
    if ( RetValue == l_True )
    {
        if ( piRetValue )
            *piRetValue = 0;
        return NULL;
    }
    if ( fVerbose )
    {
//        Abc_Print( 1, "%6d", (int)pSat->stats.conflicts - nConfPrev );
//        Abc_Print( 1, "UNSAT after %7d conflicts.      ", pSat->stats.conflicts );
//        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    assert( RetValue == l_False );
    // derive the UNSAT core
    clk = Abc_Clock();
    vCore = (Vec_Int_t *)Sat_ProofCore( pSat );
    if ( vCore )
        Vec_IntSort( vCore, 1 );
    if ( fVerbose )
    {
//        Abc_Print( 1, "Core is %8d vars    (out of %8d).   ", Vec_IntSize(vCore), sat_solver2_nvars(pSat) );
//        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    return vCore;
}